

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.cpp
# Opt level: O3

shared_ptr<mocker::ir::IRInst> __thiscall
mocker::replaceTerminatorLabel
          (mocker *this,shared_ptr<mocker::ir::IRInst> *inst,size_t oldLabel,size_t newLabel)

{
  element_type *peVar1;
  size_t sVar2;
  size_t sVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp_1;
  undefined8 *puVar5;
  undefined8 *puVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  shared_ptr<mocker::ir::IRInst> sVar8;
  undefined1 local_49;
  Branch *local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_40;
  shared_ptr<mocker::ir::Label> local_38;
  
  peVar1 = (inst->super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if (peVar1->type == Branch) {
    this_00 = (inst->super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>)._M_refcount
              ._M_pi;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_00->_M_use_count = this_00->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_00->_M_use_count = this_00->_M_use_count + 1;
      }
    }
    sVar2 = *(size_t *)(*(long *)&peVar1[2].type + 8);
    sVar3 = *(size_t *)(*(long *)&peVar1[3].type + 8);
    if (sVar2 == sVar3) {
      __assert_fail("p->getThen()->getID() != p->getElse()->getID()",
                    "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/optim/helper.cpp"
                    ,0x5e,
                    "std::shared_ptr<ir::IRInst> mocker::replaceTerminatorLabel(const std::shared_ptr<ir::IRInst> &, std::size_t, std::size_t)"
                   );
    }
    if (sVar2 == oldLabel) {
      local_38.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x20);
      (local_38.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
      ->_M_use_count = 1;
      (local_38.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
      ->_M_weak_count = 1;
      (local_38.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
      ->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_001e8af0;
      local_38.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)
           (local_38.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi + 1);
      local_38.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      [1]._vptr__Sp_counted_base = (_func_int **)&PTR__Addr_001e8b68;
      local_38.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      [1]._M_use_count = (int)newLabel;
      local_38.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      [1]._M_weak_count = (int)(newLabel >> 0x20);
      local_48 = (Branch *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<mocker::ir::Branch,std::allocator<mocker::ir::Branch>,std::shared_ptr<mocker::ir::Addr>const&,std::shared_ptr<mocker::ir::Label>,std::shared_ptr<mocker::ir::Label>const&>
                (&_Stack_40,&local_48,(allocator<mocker::ir::Branch> *)&local_49,
                 (shared_ptr<mocker::ir::Addr> *)&peVar1[1].type,&local_38,
                 (shared_ptr<mocker::ir::Label> *)&peVar1[3].type);
      _Var7._M_pi = extraout_RDX;
    }
    else {
      if (sVar3 != oldLabel) {
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/optim/helper.cpp"
                      ,0x67,
                      "std::shared_ptr<ir::IRInst> mocker::replaceTerminatorLabel(const std::shared_ptr<ir::IRInst> &, std::size_t, std::size_t)"
                     );
      }
      local_38.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x20);
      (local_38.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
      ->_M_use_count = 1;
      (local_38.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
      ->_M_weak_count = 1;
      (local_38.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
      ->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_001e8af0;
      local_38.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)
           (local_38.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi + 1);
      local_38.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      [1]._vptr__Sp_counted_base = (_func_int **)&PTR__Addr_001e8b68;
      local_38.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      [1]._M_use_count = (int)newLabel;
      local_38.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      [1]._M_weak_count = (int)(newLabel >> 0x20);
      local_48 = (Branch *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<mocker::ir::Branch,std::allocator<mocker::ir::Branch>,std::shared_ptr<mocker::ir::Addr>const&,std::shared_ptr<mocker::ir::Label>const&,std::shared_ptr<mocker::ir::Label>>
                (&_Stack_40,&local_48,(allocator<mocker::ir::Branch> *)&local_49,
                 (shared_ptr<mocker::ir::Addr> *)&peVar1[1].type,
                 (shared_ptr<mocker::ir::Label> *)&peVar1[2].type,&local_38);
      _Var7._M_pi = extraout_RDX_00;
    }
    _Var4._M_pi = _Stack_40._M_pi;
    _Stack_40._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    *(Branch **)this = local_48;
    *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8) = _Var4._M_pi;
    local_48 = (Branch *)0x0;
    if (local_38.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_38.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
      _Var7._M_pi = extraout_RDX_01;
    }
  }
  else {
    if (peVar1->type != Jump) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/optim/helper.cpp"
                    ,0x69,
                    "std::shared_ptr<ir::IRInst> mocker::replaceTerminatorLabel(const std::shared_ptr<ir::IRInst> &, std::size_t, std::size_t)"
                   );
    }
    this_00 = (inst->super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>)._M_refcount
              ._M_pi;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_00->_M_use_count = this_00->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_00->_M_use_count = this_00->_M_use_count + 1;
      }
    }
    if (*(size_t *)(*(long *)&peVar1[1].type + 8) != oldLabel) {
      __assert_fail("p->getLabel()->getID() == oldLabel",
                    "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/optim/helper.cpp"
                    ,0x5a,
                    "std::shared_ptr<ir::IRInst> mocker::replaceTerminatorLabel(const std::shared_ptr<ir::IRInst> &, std::size_t, std::size_t)"
                   );
    }
    puVar5 = (undefined8 *)operator_new(0x20);
    puVar5[1] = 0x100000001;
    *puVar5 = &PTR___Sp_counted_ptr_inplace_001e8af0;
    puVar5[2] = &PTR__Addr_001e8b68;
    puVar5[3] = newLabel;
    puVar6 = (undefined8 *)operator_new(0x38);
    _Var7._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(puVar6 + 2);
    puVar6[1] = 0x100000001;
    *puVar6 = &PTR___Sp_counted_ptr_inplace_001e8cb8;
    *(undefined4 *)(puVar6 + 3) = 0xc;
    puVar6[2] = &PTR__Jump_001e8d08;
    puVar6[4] = &PTR__Jump_001e8d28;
    puVar6[5] = puVar5 + 2;
    puVar6[6] = puVar5;
    *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)this = _Var7._M_pi;
    *(undefined8 **)(this + 8) = puVar6;
  }
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    _Var7._M_pi = extraout_RDX_02;
  }
  sVar8.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var7._M_pi;
  sVar8.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<mocker::ir::IRInst>)
         sVar8.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<ir::IRInst>
replaceTerminatorLabel(const std::shared_ptr<ir::IRInst> &inst,
                       std::size_t oldLabel, std::size_t newLabel) {
  if (auto p = ir::dyc<ir::Jump>(inst)) {
    assert(p->getLabel()->getID() == oldLabel);
    return std::make_shared<ir::Jump>(std::make_shared<ir::Label>(newLabel));
  }
  if (auto p = ir::dyc<ir::Branch>(inst)) {
    assert(p->getThen()->getID() != p->getElse()->getID());
    if (p->getThen()->getID() == oldLabel)
      return std::make_shared<ir::Branch>(p->getCondition(),
                                          std::make_shared<ir::Label>(newLabel),
                                          p->getElse());
    if (p->getElse()->getID() == oldLabel)
      return std::make_shared<ir::Branch>(
          p->getCondition(), p->getThen(),
          std::make_shared<ir::Label>(newLabel));
    assert(false);
  }
  assert(false);
}